

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

OPJ_UINT32 opj_tgt_decode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  opj_tgt_node_t *poVar4;
  int iVar5;
  opj_tgt_node_t **ppoVar6;
  opj_tgt_node_t *stk [31];
  
  ppoVar6 = stk;
  poVar4 = tree->nodes + leafno;
  while (poVar1 = poVar4->parent, poVar1 != (opj_tgt_node *)0x0) {
    *ppoVar6 = poVar4;
    ppoVar6 = ppoVar6 + 1;
    poVar4 = poVar1;
  }
  iVar5 = 0;
  while( true ) {
    iVar2 = poVar4->low;
    if (poVar4->low < iVar5) {
      poVar4->low = iVar5;
      iVar2 = iVar5;
    }
    while ((iVar5 = iVar2, iVar5 < threshold && (iVar5 < poVar4->value))) {
      OVar3 = opj_bio_read(bio,1);
      if (OVar3 == 0) {
        iVar2 = iVar5 + 1;
      }
      else {
        poVar4->value = iVar5;
        iVar2 = iVar5;
      }
    }
    poVar4->low = iVar5;
    if (ppoVar6 == stk) break;
    poVar4 = ppoVar6[-1];
    ppoVar6 = ppoVar6 + -1;
  }
  return (OPJ_UINT32)(poVar4->value < threshold);
}

Assistant:

OPJ_UINT32 opj_tgt_decode(opj_bio_t *bio, opj_tgt_tree_t *tree,
                          OPJ_UINT32 leafno, OPJ_INT32 threshold)
{
    opj_tgt_node_t *stk[31];
    opj_tgt_node_t **stkptr;
    opj_tgt_node_t *node;
    OPJ_INT32 low;

    stkptr = stk;
    node = &tree->nodes[leafno];
    while (node->parent) {
        *stkptr++ = node;
        node = node->parent;
    }

    low = 0;
    for (;;) {
        if (low > node->low) {
            node->low = low;
        } else {
            low = node->low;
        }
        while (low < threshold && low < node->value) {
            if (opj_bio_read(bio, 1)) {
                node->value = low;
            } else {
                ++low;
            }
        }
        node->low = low;
        if (stkptr == stk) {
            break;
        }
        node = *--stkptr;
    }

    return (node->value < threshold) ? 1 : 0;
}